

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommand.cxx
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_3e690d::Helper::MakeFilesFullPath
          (Helper *this,char *modeName,string *basePath,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *relFiles,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *absFiles)

{
  bool bVar1;
  cmAlphaNum local_190;
  cmAlphaNum local_160;
  string local_130;
  cmAlphaNum local_110;
  cmAlphaNum local_e0;
  string local_b0;
  size_type local_80;
  size_type gpos;
  string file;
  string *relFile;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *absFiles_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *relFiles_local;
  string *basePath_local;
  char *modeName_local;
  Helper *this_local;
  
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(relFiles);
  relFile = (string *)
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::end(relFiles);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&relFile), bVar1) {
    file.field_2._8_8_ =
         __gnu_cxx::
         __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::operator*(&__end1);
    std::__cxx11::string::string((string *)&gpos,(string *)file.field_2._8_8_);
    local_80 = cmGeneratorExpression::Find((string *)&gpos);
    if ((local_80 != 0) && (bVar1 = cmsys::SystemTools::FileIsFullPath((string *)&gpos), !bVar1)) {
      cmAlphaNum::cmAlphaNum(&local_e0,basePath);
      cmAlphaNum::cmAlphaNum(&local_110,'/');
      cmStrCat<std::__cxx11::string>
                (&local_b0,&local_e0,&local_110,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 file.field_2._8_8_);
      std::__cxx11::string::operator=((string *)&gpos,(string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
    }
    if (((local_80 != 0xffffffffffffffff) ||
        (bVar1 = cmsys::SystemTools::FileIsSymlink((string *)&gpos), bVar1)) ||
       (bVar1 = cmsys::SystemTools::FileIsDirectory((string *)&gpos), !bVar1)) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(absFiles,(value_type *)&gpos);
      bVar1 = false;
    }
    else {
      cmAlphaNum::cmAlphaNum(&local_160,modeName);
      cmAlphaNum::cmAlphaNum(&local_190," given directory \"");
      cmStrCat<std::__cxx11::string,char[14]>
                (&local_130,&local_160,&local_190,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 file.field_2._8_8_,(char (*) [14])"\" to install.");
      SetError(this,&local_130);
      std::__cxx11::string::~string((string *)&local_130);
      this_local._7_1_ = 0;
      bVar1 = true;
    }
    std::__cxx11::string::~string((string *)&gpos);
    if (bVar1) goto LAB_002f7319;
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  this_local._7_1_ = 1;
LAB_002f7319:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Helper::MakeFilesFullPath(const char* modeName,
                               const std::string& basePath,
                               const std::vector<std::string>& relFiles,
                               std::vector<std::string>& absFiles)
{
  for (std::string const& relFile : relFiles) {
    std::string file = relFile;
    std::string::size_type gpos = cmGeneratorExpression::Find(file);
    if (gpos != 0 && !cmSystemTools::FileIsFullPath(file)) {
      file = cmStrCat(basePath, '/', relFile);
    }

    // Make sure the file is not a directory.
    if (gpos == std::string::npos && !cmSystemTools::FileIsSymlink(file) &&
        cmSystemTools::FileIsDirectory(file)) {
      this->SetError(
        cmStrCat(modeName, " given directory \"", relFile, "\" to install."));
      return false;
    }
    // Store the file for installation.
    absFiles.push_back(std::move(file));
  }
  return true;
}